

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O2

void __thiscall E64::blitter_ic::terminal_putsymbol(blitter_ic *this,uint8_t number,char symbol)

{
  uint16_t *puVar1;
  undefined2 uVar2;
  blit_t *pbVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  
  uVar4 = CONCAT71(in_register_00000031,number) & 0xffffffff;
  terminal_putsymbol_at_cursor(this,number,symbol);
  pbVar3 = this->blit;
  uVar2 = pbVar3[uVar4].cursor_position;
  pbVar3[uVar4].cursor_position = uVar2 + 1;
  if (pbVar3[uVar4].tiles <= (ushort)(uVar2 + 1)) {
    terminal_add_bottom_row(this,(uint8_t)uVar4);
    puVar1 = &this->blit[uVar4].cursor_position;
    *puVar1 = *puVar1 - (ushort)this->blit[uVar4].columns;
  }
  return;
}

Assistant:

void E64::blitter_ic::terminal_putsymbol(uint8_t number, char symbol)
{
	terminal_putsymbol_at_cursor(number, symbol);
	blit[number].cursor_position++;
	if (blit[number].cursor_position >= blit[number].get_tiles()) {
		terminal_add_bottom_row(number);
		blit[number].cursor_position -= blit[number].get_columns();
	}
}